

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Synth.cpp
# Opt level: O2

void __thiscall MT32Emu::Synth::playSysexNow(Synth *this,Bit8u *sysex,Bit32u len)

{
  ulong uVar1;
  Bit32u BVar2;
  char *fmt;
  
  if (len < 2) {
    printDebug(this,"playSysex: Message is too short for sysex (%d bytes)",(ulong)len);
  }
  if (*sysex == 0xf0) {
    BVar2 = len + (len == 0);
    for (uVar1 = 1; uVar1 < len; uVar1 = uVar1 + 1) {
      if (sysex[uVar1] == 0xf7) {
        BVar2 = (Bit32u)uVar1;
        break;
      }
    }
    if (BVar2 != len) {
      playSysexWithoutFraming(this,sysex + 1,BVar2 - 1);
      return;
    }
    fmt = "playSysex: Message lacks end-of-sysex (0xf7)";
  }
  else {
    fmt = "playSysex: Message lacks start-of-sysex (0xF0)";
  }
  printDebug(this,fmt);
  return;
}

Assistant:

void Synth::playSysexNow(const Bit8u *sysex, Bit32u len) {
	if (len < 2) {
		printDebug("playSysex: Message is too short for sysex (%d bytes)", len);
	}
	if (sysex[0] != 0xF0) {
		printDebug("playSysex: Message lacks start-of-sysex (0xF0)");
		return;
	}
	// Due to some programs (e.g. Java) sending buffers with junk at the end, we have to go through and find the end marker rather than relying on len.
	Bit32u endPos;
	for (endPos = 1; endPos < len; endPos++) {
		if (sysex[endPos] == 0xF7) {
			break;
		}
	}
	if (endPos == len) {
		printDebug("playSysex: Message lacks end-of-sysex (0xf7)");
		return;
	}
	playSysexWithoutFraming(sysex + 1, endPos - 1);
}